

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_2_5::Header::erase(Header *this,char *name)

{
  bool bVar1;
  ArgExc *this_00;
  char *in_RSI;
  Name *in_RDI;
  iterator i;
  stringstream _iex_throw_s;
  map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
  *in_stack_fffffffffffffd28;
  iterator in_stack_fffffffffffffd38;
  _Self local_2b8 [33];
  _Self local_1b0 [3];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  if (*in_RSI != '\0') {
    Name::Name(in_RDI,(char *)in_stack_fffffffffffffd28);
    local_1b0[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         ::find(in_stack_fffffffffffffd28,(key_type *)0x120ea0);
    local_2b8[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         ::end(in_stack_fffffffffffffd28);
    bVar1 = std::operator!=(local_1b0,local_2b8);
    if (bVar1) {
      std::
      map<Imf_2_5::Name,Imf_2_5::Attribute*,std::less<Imf_2_5::Name>,std::allocator<std::pair<Imf_2_5::Name_const,Imf_2_5::Attribute*>>>
      ::erase_abi_cxx11_((map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                          *)in_RDI,in_stack_fffffffffffffd38);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"Image attribute name cannot be an empty string.");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
Header::erase (const char name[])
{
    if (name[0] == 0)
        THROW (IEX_NAMESPACE::ArgExc, "Image attribute name cannot be an empty string.");
    
    
    AttributeMap::iterator i = _map.find (name);
    if (i != _map.end())
        _map.erase (i);

}